

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunc.cpp
# Opt level: O0

ULONG CaseInsensitiveComputeHash(LPCOLESTR posz)

{
  OLECHAR local_16;
  ULONG local_14;
  char16 ch;
  LPCOLESTR pOStack_10;
  ULONG luHash;
  LPCOLESTR posz_local;
  
  local_14 = 0;
  pOStack_10 = posz;
  while( true ) {
    local_16 = *pOStack_10;
    if (local_16 == L'\0') break;
    if (((ushort)local_16 < 0x5b) && (0x40 < (ushort)local_16)) {
      local_16 = local_16 + L' ';
    }
    local_14 = local_14 * 0x11 + (uint)(ushort)local_16;
    pOStack_10 = pOStack_10 + 1;
  }
  return local_14;
}

Assistant:

ULONG CaseInsensitiveComputeHash(LPCOLESTR posz)
{
    ULONG luHash = 0;
    char16 ch;
    while (0 != (ch = *(char16 *)posz++))
    {
        if (ch <= 'Z' && ch >= 'A')
            ch += 'a' - 'A';
        luHash = 17 * luHash + ch;
    }
    return luHash;
}